

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O1

int run_test_active(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer;
  undefined1 local_80 [120];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_80);
  if (iVar1 == 0) {
    iVar1 = uv_is_active(local_80);
    if (iVar1 != 0) goto LAB_001819e5;
    iVar1 = uv_is_closing(local_80);
    if (iVar1 != 0) goto LAB_001819f4;
    iVar1 = uv_timer_start(local_80,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_00181a03;
    iVar1 = uv_is_active(local_80);
    if (iVar1 != 1) goto LAB_00181a12;
    iVar1 = uv_is_closing(local_80);
    if (iVar1 != 0) goto LAB_00181a21;
    iVar1 = uv_timer_stop(local_80);
    if (iVar1 != 0) goto LAB_00181a30;
    iVar1 = uv_is_active(local_80);
    if (iVar1 != 0) goto LAB_00181a3f;
    iVar1 = uv_is_closing(local_80);
    if (iVar1 != 0) goto LAB_00181a4e;
    iVar1 = uv_timer_start(local_80,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_00181a5d;
    iVar1 = uv_is_active(local_80);
    if (iVar1 != 1) goto LAB_00181a6c;
    iVar1 = uv_is_closing(local_80);
    if (iVar1 != 0) goto LAB_00181a7b;
    uv_close(local_80,close_cb);
    iVar1 = uv_is_active(local_80);
    if (iVar1 != 0) goto LAB_00181a8a;
    iVar1 = uv_is_closing(local_80);
    if (iVar1 != 1) goto LAB_00181a99;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00181aa8;
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00181ac6;
    }
  }
  else {
    run_test_active_cold_1();
LAB_001819e5:
    run_test_active_cold_2();
LAB_001819f4:
    run_test_active_cold_3();
LAB_00181a03:
    run_test_active_cold_4();
LAB_00181a12:
    run_test_active_cold_5();
LAB_00181a21:
    run_test_active_cold_6();
LAB_00181a30:
    run_test_active_cold_7();
LAB_00181a3f:
    run_test_active_cold_8();
LAB_00181a4e:
    run_test_active_cold_9();
LAB_00181a5d:
    run_test_active_cold_10();
LAB_00181a6c:
    run_test_active_cold_11();
LAB_00181a7b:
    run_test_active_cold_12();
LAB_00181a8a:
    run_test_active_cold_13();
LAB_00181a99:
    run_test_active_cold_14();
LAB_00181aa8:
    run_test_active_cold_15();
  }
  run_test_active_cold_16();
LAB_00181ac6:
  run_test_active_cold_17();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
          ,0x27,"0 && \"timer_cb should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_EQ(1, uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}